

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  bool bVar1;
  LogMessage *pLVar2;
  string *value;
  SourceCodeInfo *other;
  allocator<char> local_e1;
  string local_e0;
  LogFinisher local_b9;
  LogMessage local_b8;
  int local_7c;
  undefined1 local_78 [8];
  LocationRecorder root_location;
  undefined1 local_58 [8];
  SourceCodeInfo source_code_info;
  FileDescriptorProto *file_local;
  Tokenizer *input_local;
  Parser *this_local;
  
  this->input_ = input;
  this->had_errors_ = false;
  source_code_info.location_.super_RepeatedPtrFieldBase.rep_ = (Rep *)file;
  std::__cxx11::string::clear();
  SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)local_58);
  this->source_code_info_ = (SourceCodeInfo *)local_58;
  bVar1 = LookingAtType(this,TYPE_START);
  if (bVar1) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder((LocationRecorder *)local_78,this);
  if (((this->require_syntax_identifier_ & 1U) != 0) || (bVar1 = LookingAt(this,"syntax"), bVar1)) {
    bVar1 = ParseSyntaxIdentifier(this,(LocationRecorder *)local_78);
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_7c = 1;
      goto LAB_004be093;
    }
    if (source_code_info.location_.super_RepeatedPtrFieldBase.rep_ != (Rep *)0x0) {
      FileDescriptorProto::set_syntax
                ((FileDescriptorProto *)source_code_info.location_.super_RepeatedPtrFieldBase.rep_,
                 &this->syntax_identifier_);
    }
  }
  else if ((this->stop_after_syntax_identifier_ & 1U) == 0) {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x222);
    pLVar2 = internal::LogMessage::operator<<(&local_b8,"No syntax specified for the proto file: ");
    value = FileDescriptorProto::name_abi_cxx11_
                      ((FileDescriptorProto *)
                       source_code_info.location_.super_RepeatedPtrFieldBase.rep_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,". Please use \'syntax = \"proto2\";\' ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"or \'syntax = \"proto3\";\' to specify a syntax ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"version. (Defaulted to proto2 syntax.)");
    internal::LogFinisher::operator=(&local_b9,pLVar2);
    internal::LogMessage::~LogMessage(&local_b8);
    std::__cxx11::string::operator=((string *)&this->syntax_identifier_,"proto2");
  }
  if ((this->stop_after_syntax_identifier_ & 1U) == 0) {
    while (bVar1 = AtEnd(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = ParseTopLevelStatement
                        (this,(FileDescriptorProto *)
                              source_code_info.location_.super_RepeatedPtrFieldBase.rep_,
                         (LocationRecorder *)local_78);
      if (!bVar1) {
        SkipStatement(this);
        bVar1 = LookingAt(this,"}");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,"Unmatched \"}\".",&local_e1);
          AddError(this,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::allocator<char>::~allocator(&local_e1);
          io::Tokenizer::NextWithComments
                    (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
                     &this->upcoming_doc_comments_);
        }
      }
    }
    local_7c = 0;
  }
  else {
    this_local._7_1_ = (this->had_errors_ ^ 0xffU) & 1;
    local_7c = 1;
  }
LAB_004be093:
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_78);
  if (local_7c == 0) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    if (source_code_info.location_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
      __assert_fail("file != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                    ,0x23d,
                    "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                   );
    }
    other = FileDescriptorProto::mutable_source_code_info
                      ((FileDescriptorProto *)
                       source_code_info.location_.super_RepeatedPtrFieldBase.rep_);
    SourceCodeInfo::Swap((SourceCodeInfo *)local_58,other);
    this_local._7_1_ = (this->had_errors_ ^ 0xffU) & 1;
    local_7c = 1;
  }
  SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier(root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != NULL) file->set_syntax(syntax_identifier_);
    } else if (!stop_after_syntax_identifier_) {
      GOOGLE_LOG(WARNING) << "No syntax specified for the proto file: "
                   << file->name() << ". Please use 'syntax = \"proto2\";' "
                   << "or 'syntax = \"proto3\";' to specify a syntax "
                   << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  assert(file != NULL);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}